

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O3

void __thiscall
QShortcutEvent::QShortcutEvent
          (QShortcutEvent *this,QKeySequence *key,QShortcut *shortcut,bool ambiguous)

{
  long lVar1;
  QDebug this_00;
  bool bVar2;
  long lVar3;
  long lVar4;
  QKeySequence *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QDebug local_68;
  QKeySequence local_60;
  undefined1 local_58 [8];
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QEvent::QEvent(&this->super_QEvent,Shortcut);
  *(undefined ***)this = &PTR__QShortcutEvent_007d3688;
  QKeySequence::QKeySequence(&this->m_sequence,key);
  this->m_shortcutId = 0;
  this->m_ambiguous = ambiguous;
  if (shortcut != (QShortcut *)0x0) {
    lVar1 = *(long *)&shortcut->field_0x8;
    if (*(long *)(lVar1 + 0x88) != 0) {
      this_01 = *(QKeySequence **)(lVar1 + 0x80);
      lVar4 = 8 - (long)this_01;
      lVar3 = *(long *)(lVar1 + 0x88) << 3;
      do {
        if (lVar3 == 0) goto LAB_002c40d4;
        bVar2 = QKeySequence::operator==(this_01,key);
        lVar4 = lVar4 + -8;
        this_01 = this_01 + 1;
        lVar3 = lVar3 + -8;
      } while (!bVar2);
      lVar3 = -(lVar4 + *(long *)(lVar1 + 0x80)) >> 3;
      if (-1 < lVar3) {
        this->m_shortcutId = *(int *)(*(long *)(lVar1 + 0xb8) + lVar3 * 4);
        goto LAB_002c40b1;
      }
    }
LAB_002c40d4:
    QMessageLogger::warning();
    this_00.stream = local_68.stream;
    QVar5.m_data = (storage_type *)0x2e;
    QVar5.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(&(this_00.stream)->ts,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if ((local_68.stream)->space == true) {
      QTextStream::operator<<(&(local_68.stream)->ts,' ');
    }
    (local_68.stream)->ref = (local_68.stream)->ref + 1;
    ::operator<<((Stream *)local_58,&local_60);
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug(&local_68);
  }
LAB_002c40b1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QShortcutEvent::QShortcutEvent(const QKeySequence &key, const QShortcut *shortcut, bool ambiguous)
    : QEvent(Shortcut), m_sequence(key), m_shortcutId(0), m_ambiguous(ambiguous)
{
    if (shortcut) {
        auto priv = static_cast<const QShortcutPrivate *>(QShortcutPrivate::get(shortcut));
        auto index = priv->sc_sequences.indexOf(key);
        if (index < 0) {
            qWarning() << "Given QShortcut does not contain key-sequence " << key;
            return;
        }
        m_shortcutId = priv->sc_ids[index];
    }
}